

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_create_dev_obj(nvrm_ioctl_create_dev_obj *s)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("cid");
    if (iVar2 != 0) goto LAB_00259b69;
  }
  else {
LAB_00259b69:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar3 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("handle");
    if (iVar2 != 0) goto LAB_00259baf;
  }
  else {
LAB_00259baf:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar3,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  uVar1 = s->unk08;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("unk08");
    if (iVar2 != 0) goto LAB_00259c02;
  }
  else {
LAB_00259c02:
    fprintf(_stdout,"%sunk08: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar3 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->unk0c;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("unk0c");
    if (iVar2 != 0) goto LAB_00259c48;
  }
  else {
LAB_00259c48:
    fprintf(_stdout,"%sunk0c: 0x%08x",pcVar3,(ulong)uVar1);
    pcVar3 = nvrm_sep;
  }
  uVar1 = s->ptr;
  nvrm_pfx = pcVar3;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("ptr");
    if (iVar2 != 0) goto LAB_00259c8a;
  }
  else {
LAB_00259c8a:
    fprintf(_stdout,"%sptr: 0x%08x",pcVar3,(ulong)uVar1);
    pcVar3 = nvrm_sep;
  }
  uVar1 = s->unk14;
  nvrm_pfx = pcVar3;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("unk14");
    if (iVar2 != 0) goto LAB_00259ccc;
  }
  else {
LAB_00259ccc:
    fprintf(_stdout,"%sunk14: 0x%08x",pcVar3,(ulong)uVar1);
    pcVar3 = nvrm_sep;
  }
  uVar1 = s->unk18;
  nvrm_pfx = pcVar3;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("unk18");
    if (iVar2 != 0) goto LAB_00259d0e;
  }
  else {
LAB_00259d0e:
    fprintf(_stdout,"%sunk18: 0x%08x",pcVar3,(ulong)uVar1);
    pcVar3 = nvrm_sep;
  }
  uVar1 = s->unk1c;
  nvrm_pfx = pcVar3;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("unk1c");
    if (iVar2 == 0) goto LAB_00259d74;
  }
  fprintf(_stdout,"%sunk1c: 0x%08x",pcVar3,(ulong)uVar1);
  pcVar3 = nvrm_sep;
LAB_00259d74:
  nvrm_pfx = pcVar3;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_dev_obj(struct nvrm_ioctl_create_dev_obj *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_x32(s, unk08);
	nvrm_print_x32(s, unk0c);
	nvrm_print_x32(s, ptr);
	nvrm_print_x32(s, unk14);
	nvrm_print_x32(s, unk18);
	nvrm_print_x32(s, unk1c);
	nvrm_print_ln();
}